

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noises.cxx
# Opt level: O0

string * __thiscall Noise::getParameter(string *__return_storage_ptr__,Noise *this,string *name)

{
  bool bVar1;
  string local_1d8;
  stringstream local_1a8 [8];
  stringstream param;
  ostream local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *name_local;
  Noise *this_local;
  
  local_20 = name;
  name_local = (string *)this;
  this_local = (Noise *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  bVar1 = std::operator==(local_20,"mean");
  if (bVar1) {
    std::ostream::operator<<(&local_198,this->noiseMu);
  }
  else {
    bVar1 = std::operator==(local_20,"std.dev.");
    if (bVar1) {
      std::ostream::operator<<(&local_198,this->noiseSigma);
    }
    else {
      bVar1 = std::operator==(local_20,"weight");
      if (bVar1) {
        std::ostream::operator<<(&local_198,this->noiseWeight);
      }
      else {
        bVar1 = std::operator==(local_20,"rate");
        if (bVar1) {
          std::ostream::operator<<(&local_198,this->noiseRate);
        }
        else {
          Parametric::getParameter(&local_1d8,(Parametric *)this,local_20);
          std::operator<<(&local_198,(string *)&local_1d8);
          std::__cxx11::string::~string((string *)&local_1d8);
        }
      }
    }
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

string Noise::getParameter( const string& name ) const
{
	stringstream param;
	if (name == "mean")
		param << noiseMu;
	else if (name == "std.dev.")
		param << noiseSigma;
	else if (name == "weight")
		param << noiseWeight;
	else if (name == "rate")
		param << noiseRate;
	else
		param << StochasticVariable::getParameter(name);
		
	return param.str();
}